

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManSimulateRound(Gia_ManSim_t *p)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int v;
  int iVar9;
  long lVar10;
  Gia_Man_t *p_00;
  long lVar11;
  int iVar12;
  int iVar13;
  
  if (p->pAig->nFront < 1) {
    __assert_fail("p->pAig->nFront > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1df,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  if (p->pAig->pObjs->Value != 0) {
    __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                  ,0x1e0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  Gia_ManSimInfoZero(p,p->pDataSim);
  iVar12 = 0;
  v = 1;
  iVar13 = 0;
  do {
    p_00 = p->pAig;
    if (p_00->nObjs <= v) {
LAB_005fb1f1:
      if (p_00->vCis->nSize != iVar12) {
        __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                      ,500,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
      }
      if (p_00->vCos->nSize != iVar13) {
        __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                      ,0x1f5,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
      }
      return;
    }
    pGVar4 = Gia_ManObj(p_00,v);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      p_00 = p->pAig;
      goto LAB_005fb1f1;
    }
    uVar6 = *(ulong *)pGVar4;
    uVar7 = (uint)uVar6;
    if ((int)uVar7 < 0) {
      uVar1 = pGVar4->Value;
      if ((~uVar7 & 0x1fffffff) == 0) {
        if (p->pAig->nFront <= (int)uVar1) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                        ,0x1f0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        puVar2 = p->pDataSim;
        uVar7 = p->nWords;
        puVar3 = p->pDataSimCis;
        for (uVar6 = (ulong)uVar7; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
          puVar2[(long)(int)(uVar1 * uVar7) + (uVar6 - 1)] =
               puVar3[(long)(int)(uVar7 * iVar12) + (uVar6 - 1)];
        }
        iVar12 = iVar12 + 1;
      }
      else {
        if (uVar1 != 0x1fffffff) {
          __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                        ,0x1eb,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        puVar2 = p->pDataSimCos;
        uVar1 = p->nWords;
        uVar6 = (ulong)uVar1;
        iVar9 = uVar1 * iVar13;
        iVar13 = iVar13 + 1;
        puVar3 = p->pDataSim;
        lVar8 = (long)(int)((uVar7 & 0x1fffffff) * uVar1);
        if ((uVar7 >> 0x1d & 1) == 0) {
          for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
            puVar2[(long)iVar9 + (uVar6 - 1)] = puVar3[lVar8 + (uVar6 - 1)];
          }
        }
        else {
          for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
            puVar2[(long)iVar9 + (uVar6 - 1)] = ~puVar3[lVar8 + (uVar6 - 1)];
          }
        }
      }
    }
    else {
      if (p->pAig->nFront <= (int)pGVar4->Value) {
        __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim.c"
                      ,0x1e6,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
      }
      puVar2 = p->pDataSim;
      uVar1 = p->nWords;
      uVar5 = (ulong)uVar1;
      lVar8 = (long)(int)(pGVar4->Value * uVar1);
      lVar10 = (long)(int)((uVar7 & 0x1fffffff) * uVar1);
      lVar11 = (long)(int)(((uint)(uVar6 >> 0x20) & 0x1fffffff) * uVar1);
      if ((uVar7 >> 0x1d & 1) == 0) {
        if ((uVar6 >> 0x3d & 1) == 0) {
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            puVar2[lVar8 + (uVar5 - 1)] =
                 puVar2[lVar11 + (uVar5 - 1)] & puVar2[lVar10 + (uVar5 - 1)];
          }
        }
        else {
          for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            puVar2[lVar8 + (uVar5 - 1)] =
                 ~puVar2[lVar11 + (uVar5 - 1)] & puVar2[lVar10 + (uVar5 - 1)];
          }
        }
      }
      else if ((uVar6 >> 0x3d & 1) == 0) {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          puVar2[lVar8 + (uVar5 - 1)] = ~puVar2[lVar10 + (uVar5 - 1)] & puVar2[lVar11 + (uVar5 - 1)]
          ;
        }
      }
      else {
        for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          puVar2[lVar8 + (uVar5 - 1)] =
               ~(puVar2[lVar11 + (uVar5 - 1)] | puVar2[lVar10 + (uVar5 - 1)]);
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManSimulateRound( Gia_ManSim_t * p )
{
    Gia_Obj_t * pObj;
    int i, iCis = 0, iCos = 0;
    assert( p->pAig->nFront > 0 );
    assert( Gia_ManConst0(p->pAig)->Value == 0 );
    Gia_ManSimInfoZero( p, Gia_SimData(p, 0) );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAndOrConst0(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateNode( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == GIA_NONE );
            Gia_ManSimulateCo( p, iCos++, pObj );
        }
        else // if ( Gia_ObjIsCi(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateCi( p, pObj, iCis++ );
        }
    }
    assert( Gia_ManCiNum(p->pAig) == iCis );
    assert( Gia_ManCoNum(p->pAig) == iCos );
}